

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::
TestFactoryImpl<solitaire::cards::ShuffledDeckGeneratorTest_generatedDecksHaveDifferentOrder_Test>::
CreateTest(TestFactoryImpl<solitaire::cards::ShuffledDeckGeneratorTest_generatedDecksHaveDifferentOrder_Test>
           *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00[1]._vptr_Test = (_func_int **)&PTR__DeckGenerator_003336b0;
  this_00->_vptr_Test = (_func_int **)&PTR__ShuffledDeckGeneratorTest_00325910;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }